

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event_queue.hpp
# Opt level: O0

Size_t __thiscall
cppurses::detail::Event_queue::View<(cppurses::Event::Type)10>::Move_iterator::find_next
          (Move_iterator *this,Size_t from)

{
  Guard_t GVar1;
  bool bVar2;
  reference pvVar3;
  pointer pEVar4;
  size_type sVar5;
  Widget *local_58 [3];
  Widget *local_40;
  undefined4 local_34;
  mutex_type *local_30;
  size_type end;
  Guard_t g;
  Size_t from_local;
  Move_iterator *this_local;
  
  g._M_device = (mutex_type *)from;
  std::lock_guard<std::mutex>::lock_guard((lock_guard<std::mutex> *)&end,this->mtx_);
  local_30 = (mutex_type *)
             std::
             vector<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
             ::size(this->events_);
  if (g._M_device != local_30) {
    while (g._M_device = (mutex_type *)
                         ((long)&((g._M_device)->super___mutex_base)._M_mutex.__align + 1),
          g._M_device != local_30) {
      pvVar3 = std::
               vector<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
               ::operator[](this->events_,(size_type)g._M_device);
      bVar2 = std::operator==(pvVar3,(nullptr_t)0x0);
      if (!bVar2) {
        pvVar3 = std::
                 vector<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
                 ::operator[](this->events_,(size_type)g._M_device);
        pEVar4 = std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>::operator->
                           (pvVar3);
        local_40 = Event::receiver(pEVar4);
        sVar5 = std::
                set<cppurses::Widget_*,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
                ::count(&this->already_sent_,&local_40);
        if (sVar5 == 0) {
          pvVar3 = std::
                   vector<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
                   ::operator[](this->events_,(size_type)g._M_device);
          pEVar4 = std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>::
                   operator->(pvVar3);
          local_58[0] = Event::receiver(pEVar4);
          std::
          set<cppurses::Widget_*,_std::less<cppurses::Widget_*>,_std::allocator<cppurses::Widget_*>_>
          ::insert(&this->already_sent_,local_58);
          break;
        }
        pvVar3 = std::
                 vector<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>,_std::allocator<std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>_>_>
                 ::operator[](this->events_,(size_type)g._M_device);
        std::unique_ptr<cppurses::Event,_std::default_delete<cppurses::Event>_>::reset
                  (pvVar3,(pointer)0x0);
      }
    }
  }
  GVar1._M_device = g._M_device;
  local_34 = 1;
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)&end);
  return (Size_t)GVar1._M_device;
}

Assistant:

inline auto Event_queue::View<Event::Paint>::Move_iterator::find_next(
    Size_t from) -> Size_t
{
    Guard_t g{mtx_};
    const auto end = events_.size();
    if (from == end)
        return from;
    while (++from != end) {
        if (events_[from] == nullptr)
            continue;
        if (already_sent_.count(&(events_[from]->receiver())) > 0) {
            events_[from].reset(nullptr);
            continue;
        }
        already_sent_.insert(&(events_[from]->receiver()));
        break;
    }
    return from;
}